

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

uint __thiscall jpgd::jpeg_decoder::get_char(jpeg_decoder *this)

{
  int iVar1;
  byte *pbVar2;
  uint c;
  int t;
  jpeg_decoder *this_local;
  
  if ((this->m_in_buf_left == 0) && (prep_in_buffer(this), this->m_in_buf_left == 0)) {
    iVar1 = this->m_tem_flag;
    this->m_tem_flag = this->m_tem_flag ^ 1;
    if (iVar1 == 0) {
      this_local._4_4_ = 0xff;
    }
    else {
      this_local._4_4_ = 0xd9;
    }
  }
  else {
    pbVar2 = this->m_pIn_buf_ofs;
    this->m_pIn_buf_ofs = pbVar2 + 1;
    this_local._4_4_ = (uint)*pbVar2;
    this->m_in_buf_left = this->m_in_buf_left + -1;
  }
  return this_local._4_4_;
}

Assistant:

inline uint jpeg_decoder::get_char()
	{
		// Any bytes remaining in buffer?
		if (!m_in_buf_left)
		{
			// Try to get more bytes.
			prep_in_buffer();
			// Still nothing to get?
			if (!m_in_buf_left)
			{
				// Pad the end of the stream with 0xFF 0xD9 (EOI marker)
				int t = m_tem_flag;
				m_tem_flag ^= 1;
				if (t)
					return 0xD9;
				else
					return 0xFF;
			}
		}

		uint c = *m_pIn_buf_ofs++;
		m_in_buf_left--;

		return c;
	}